

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_to_curve.cc
# Opt level: O1

int ec_hash_to_curve_p384_xmd_sha512_sswu_draft07
              (EC_GROUP *group,EC_JACOBIAN *out,uint8_t *dst,size_t dst_len,uint8_t *msg,
              size_t msg_len)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  EVP_MD *md;
  undefined8 local_d0;
  EC_FELEM c2;
  EC_FELEM Z;
  
  iVar1 = EC_GROUP_get_curve_name((EC_GROUP *)group);
  if (iVar1 == 0x2cb) {
    c2.words[6] = 0;
    c2.words[7] = 0;
    c2.words[4] = 0;
    c2.words[5] = 0;
    c2.words[2] = 0;
    c2.words[3] = 0;
    c2.words[0] = 0;
    c2.words[1] = 0;
    c2.words[8]._0_2_ = 0;
    local_d0 = dst;
    uVar2 = BN_num_bytes(&(group->field).N);
    *(uint8_t *)((long)c2.words + ((ulong)uVar2 - 1)) = '\f';
    iVar3 = ec_felem_from_bytes(group,&Z,(uint8_t *)&c2,(ulong)uVar2);
    iVar1 = 0;
    if (iVar3 != 0) {
      iVar3 = ec_felem_from_bytes(group,&c2,kP384Sqrt12,0x30);
      iVar1 = 0;
      if (iVar3 != 0) {
        ec_felem_neg(group,&Z,&Z);
        md = EVP_sha512();
        iVar1 = hash_to_curve(group,(EVP_MD *)md,&Z,&c2,0xc0,out,local_d0,dst_len,msg,msg_len);
      }
    }
  }
  else {
    iVar1 = 0;
    ERR_put_error(0xf,0,0x82,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/hash_to_curve.cc"
                  ,0x1dc);
  }
  return iVar1;
}

Assistant:

int ec_hash_to_curve_p384_xmd_sha512_sswu_draft07(
    const EC_GROUP *group, EC_JACOBIAN *out, const uint8_t *dst, size_t dst_len,
    const uint8_t *msg, size_t msg_len) {
  // See section 8.3 of draft-irtf-cfrg-hash-to-curve-07.
  if (EC_GROUP_get_curve_name(group) != NID_secp384r1) {
    OPENSSL_PUT_ERROR(EC, EC_R_GROUP_MISMATCH);
    return 0;
  }

  // Z = -12, c2 = sqrt(12)
  EC_FELEM Z, c2;
  if (!felem_from_u8(group, &Z, 12) ||
      !ec_felem_from_bytes(group, &c2, kP384Sqrt12, sizeof(kP384Sqrt12))) {
    return 0;
  }
  ec_felem_neg(group, &Z, &Z);

  return hash_to_curve(group, EVP_sha512(), &Z, &c2, /*k=*/192, out, dst,
                       dst_len, msg, msg_len);
}